

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_api.c
# Opt level: O2

MPP_RET h265e_gen_hdr(void *ctx,MppPacket pkt)

{
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_api","enter ctx %p\n","h265e_gen_hdr",ctx);
  }
  h265e_set_extra_info((H265eCtx *)ctx);
  h265e_get_extra_info((H265eCtx *)ctx,pkt);
  if (*(long *)((long)ctx + 0x5008) == 0) {
    h265e_dpb_init((H265eDpb **)((long)ctx + 0x5008));
  }
  *(undefined4 *)(*ctx + 0x348) = 0;
  *(undefined4 *)(*ctx + 8) = 0;
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_api","leave ctx %p\n","h265e_gen_hdr",ctx);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET h265e_gen_hdr(void *ctx, MppPacket pkt)
{
    H265eCtx *p = (H265eCtx *)ctx;

    h265e_dbg_func("enter ctx %p\n", ctx);

    h265e_set_extra_info(p);
    h265e_get_extra_info(p, pkt);

    if (NULL == p->dpb)
        h265e_dpb_init(&p->dpb);

    /*
     * After gen_hdr, the change of codec/prep must be cleared to 0,
     * otherwise the change will affect the next idr frame
     */
    p->cfg->codec.h265.change = 0;
    p->cfg->prep.change = 0;

    h265e_dbg_func("leave ctx %p\n", ctx);

    return MPP_OK;
}